

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-async-pummel.c
# Opt level: O0

void async_cb(uv_async_t *handle)

{
  uv_async_t *handle_local;
  
  container->async_events = container->async_events + 1;
  handle->data = handle;
  return;
}

Assistant:

static void async_cb(uv_async_t* handle) {
  if (++callbacks == NUM_PINGS) {
    /* Tell the pummel thread to stop. */
    ACCESS_ONCE(const char*, handle->data) = stop;

    /* Wait for the pummel thread to acknowledge that it has stoppped. */
    while (ACCESS_ONCE(const char*, handle->data) != stopped)
      uv_sleep(0);

    uv_close((uv_handle_t*) handle, NULL);
  }
}